

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O1

void __thiscall StunMsg_ErrorResponse_Test::TestBody(StunMsg_ErrorResponse_Test *this)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  stun_attr_errcode *attr;
  char *pcVar4;
  stun_attr_unknown *attr_00;
  uint16_t *unknown_codes;
  char *in_R9;
  size_t i;
  size_t n;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  uint16_t unknown [3];
  uint8_t tsx_id [12];
  char reason_phrase [18];
  uint8_t expected_result [60];
  uint8_t buffer [60];
  AssertHelper local_130;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  string local_118;
  AssertHelper local_f8;
  uint16_t local_f0 [4];
  uint8_t local_e8 [16];
  char local_d8 [32];
  undefined1 local_b8 [24];
  undefined8 uStack_a0;
  char acStack_98 [32];
  stun_msg_hdr local_78 [3];
  
  builtin_strncpy(local_d8,"Unknown Attribute",0x12);
  acStack_98[0x10] = '\0';
  acStack_98[0x11] = '\n';
  acStack_98[0x12] = '\0';
  acStack_98[0x13] = '\x06';
  acStack_98[0x14] = '\0';
  acStack_98[0x15] = '\x1a';
  acStack_98[0x16] = '\0';
  acStack_98[0x17] = '\x1b';
  acStack_98[0x18] = -0x80;
  acStack_98[0x19] = ',';
  acStack_98[0x1a] = '\0';
  acStack_98[0x1b] = '\0';
  builtin_strncpy(acStack_98,"own Attribute",0xe);
  acStack_98[0xe] = '\0';
  acStack_98[0xf] = '\0';
  local_b8._16_8_ = 0x150009002e41da29;
  uStack_a0 = 0x6e6b6e5514040000;
  local_b8._0_2_ = 0x1101;
  local_b8._2_2_ = 0x2800;
  local_b8._4_4_ = 0x42a41221;
  local_b8[8] = 'x';
  local_b8[9] = 0xad;
  local_b8[10] = '4';
  local_b8[0xb] = '3';
  local_b8[0xc] = 0xc6;
  local_b8[0xd] = 0xad;
  local_b8[0xe] = 'r';
  local_b8[0xf] = 0xc0;
  local_e8[0] = 'x';
  local_e8[1] = 0xad;
  local_e8[2] = '4';
  local_e8[3] = '3';
  local_e8[4] = 0xc6;
  local_e8[5] = 0xad;
  local_e8[6] = 'r';
  local_e8[7] = 0xc0;
  local_e8[8] = ')';
  local_e8[9] = 0xda;
  local_e8[10] = 'A';
  local_e8[0xb] = '.';
  local_f0[2] = 0x802c;
  local_f0[0] = 0x1a;
  local_f0[1] = 0x1b;
  local_128.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000003c;
  local_130.data_ = (AssertHelperData *)&DAT_0000003c;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&local_128,(unsigned_long *)&local_130);
  if ((char)local_118._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_128);
    if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_118._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x224,pcVar4);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    if (local_128.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128.ptr_ + 8))();
      }
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_118._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_118._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_128.ptr_._0_4_ = 1;
    iVar3 = stun_msg_verify((stun_msg_hdr *)local_b8,0x3c);
    local_130.data_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_118,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&local_128,(int *)&local_130);
    if ((char)local_118._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_118._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x226,pcVar4);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if (local_128.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_128.ptr_ + 8))();
        }
        local_128.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      stun_msg_hdr_init(local_78,0x111,local_e8);
      stun_attr_errcode_add(local_78,0x1a4,local_d8,'\0');
      unknown_codes = local_f0;
      stun_attr_unknown_add(local_78,unknown_codes,3,'\0');
      anon_unknown.dwarf_9b63::IsEqual((anon_unknown_dwarf_9b63 *)&local_128,local_b8,local_78,0x3c)
      ;
      if (local_128.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
        testing::Message::Message((Message *)&local_130);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_118,(internal *)&local_128,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x22d,(char *)CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                           (char)local_118._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p) !=
            &local_118.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p
                                  ),local_118.field_2._M_allocated_capacity + 1);
        }
        if (local_130.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_130.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_130.data_ + 8))();
          }
          local_130.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_128.ptr_._0_4_ = 0x111;
      uVar2 = stun_msg_type((stun_msg_hdr *)local_b8);
      local_130.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&local_118,"STUN_BINDING_ERROR_RESPONSE","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&local_128,(unsigned_short *)&local_130);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x231,pcVar4);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000003c;
      local_130.data_ = (AssertHelperData *)stun_msg_len((stun_msg_hdr *)local_b8);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_118,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&local_128,(unsigned_long *)&local_130);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x232,pcVar4);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      attr = (stun_attr_errcode *)stun_msg_next_attr((stun_msg_hdr *)local_b8,(stun_attr_hdr *)0x0);
      local_128.ptr_._0_4_ = 9;
      uVar2 = stun_attr_type((stun_attr_hdr *)attr);
      local_130.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&local_118,"STUN_ATTR_ERROR_CODE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&local_128,(unsigned_short *)&local_130);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x235,pcVar4);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_128.ptr_._0_4_ = 0x1a4;
      iVar3 = stun_attr_errcode_status(attr);
      local_130.data_._0_4_ = iVar3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_118,"420","stun_attr_errcode_status(attr_errcode)",
                 (int *)&local_128,(int *)&local_130);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x237,pcVar4);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_118._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_128.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000011;
      local_130.data_ = (AssertHelperData *)stun_attr_errcode_reason_len(attr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_118,"sizeof(reason_phrase)-1",
                 "stun_attr_errcode_reason_len(attr_errcode)",(unsigned_long *)&local_128,
                 (unsigned_long *)&local_130);
      if ((char)local_118._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_118._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x239,pcVar4);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if (local_128.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_128.ptr_ + 8))();
          }
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_118._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_118._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pcVar4 = stun_attr_errcode_reason(attr);
        anon_unknown.dwarf_9b63::IsEqual((anon_unknown_dwarf_9b63 *)&local_128,local_d8,pcVar4,0x11)
        ;
        if (local_128.ptr_._0_1_ == (anon_unknown_dwarf_9b63)0x0) {
          testing::Message::Message((Message *)&local_130);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_118,(internal *)&local_128,
                     (AssertionResult *)
                     "IsEqual(reason_phrase, stun_attr_errcode_reason(attr_errcode), sizeof(reason_phrase)-1)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x23c,(char *)CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                             (char)local_118._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_130);
          testing::internal::AssertHelper::~AssertHelper(&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p) !=
              &local_118.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                     (char)local_118._M_dataplus._M_p),
                            local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_130.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_130.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_130.data_ + 8))();
            }
            local_130.data_ = (AssertHelperData *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        attr_00 = (stun_attr_unknown *)
                  stun_msg_next_attr((stun_msg_hdr *)local_b8,(stun_attr_hdr *)attr);
        local_128.ptr_._0_4_ = 10;
        uVar2 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_130.data_._0_2_ = uVar2;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_118,"STUN_ATTR_UNKNOWN_ATTRIBUTES","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_128,(unsigned_short *)&local_130);
        if ((char)local_118._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_128);
          if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_118._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x23f,pcVar4);
          testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          if (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_128.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_128.ptr_ + 8))();
            }
            local_128.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_118._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_128.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        local_130.data_ = (AssertHelperData *)stun_attr_unknown_count(attr_00);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&local_118,"(sizeof(unknown)/sizeof(unknown[0]))",
                   "stun_attr_unknown_count(attr_unk)",(unsigned_long *)&local_128,
                   (unsigned_long *)&local_130);
        if ((char)local_118._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_128);
          if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_118._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x241,pcVar4);
          testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          if (local_128.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_128.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_128.ptr_ + 8))();
            }
            local_128.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_118._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_118._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          n = 0;
          do {
            uVar2 = stun_attr_unknown_get(attr_00,n);
            local_128.ptr_._0_2_ = uVar2;
            testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                      ((internal *)&local_118,"unknown[i]","stun_attr_unknown_get(attr_unk, i)",
                       unknown_codes,(unsigned_short *)&local_128);
            if ((char)local_118._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_128);
              pcVar4 = "";
              if ((undefined8 *)local_118._M_string_length != (undefined8 *)0x0) {
                pcVar4 = *(char **)local_118._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_130,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                         ,0x243,pcVar4);
              testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
              testing::internal::AssertHelper::~AssertHelper(&local_130);
              if (local_128.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   (local_128.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_128.ptr_ + 8))();
                }
                local_128.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_118._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            n = n + 1;
            unknown_codes = unknown_codes + 1;
          } while (n != 3);
          local_128.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_msg_next_attr((stun_msg_hdr *)local_b8,(stun_attr_hdr *)attr_00);
          local_130.data_ = (AssertHelperData *)0x0;
          testing::internal::CmpHelperEQ<_stun_attr_hdr_const*,_stun_attr_hdr_const*>
                    ((internal *)&local_118,"__null","attr_hdr",(_stun_attr_hdr **)&local_130,
                     (_stun_attr_hdr **)&local_128);
          if ((char)local_118._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_128);
            if ((undefined8 *)local_118._M_string_length == (undefined8 *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)local_118._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_130,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0x247,pcVar4);
            testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_130);
            if ((stun_attr_hdr *)local_128.ptr_ != (stun_attr_hdr *)0x0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) && ((stun_attr_hdr *)local_128.ptr_ != (stun_attr_hdr *)0x0)) {
                (**(code **)(*(long *)local_128.ptr_ + 8))();
              }
              local_128.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_118._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, ErrorResponse) {
  const char reason_phrase[] = "Unknown Attribute";
  const uint8_t expected_result[] = {
    0x01,0x11,0x00,0x28, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x09,0x00,0x15, //    ERROR-CODE attribute header
    0x00,0x00,0x04,0x14, //    class = 4, code = 20 (420)
    0x55,0x6e,0x6b,0x6e, // }
    0x6f,0x77,0x6e,0x20, // }
    0x41,0x74,0x74,0x72, // }  Reason: Unknown Attribute
    0x69,0x62,0x75,0x74, // }
    0x65,0x00,0x00,0x00, // }
    0x00,0x0A,0x00,0x06, //    UNKNOWN-ATTRIBUTES attribute header
    0x00,0x1A,0x00,0x1B, //    0x001A, 0x001B
    0x80,0x2C,0x00,0x00, //    0x802C
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_ERROR_CODE_SIZE(sizeof(reason_phrase)-1)
    + STUN_ATTR_UNKNOWN_SIZE(3)];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };
  uint16_t unknown[] = { 0x001a, 0x001b, 0x802c };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_ERROR_RESPONSE, tsx_id);
  stun_attr_errcode_add(msg_hdr, 420, reason_phrase, 0);
  stun_attr_unknown_add(msg_hdr, unknown, ARRAY_SIZE(unknown), 0);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_ERROR_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_ERROR_CODE, stun_attr_type(attr_hdr));
  stun_attr_errcode *attr_errcode = (stun_attr_errcode *)attr_hdr;
  EXPECT_EQ(420, stun_attr_errcode_status(attr_errcode));
  ASSERT_EQ(sizeof(reason_phrase)-1,
      stun_attr_errcode_reason_len(attr_errcode));
  EXPECT_TRUE(IsEqual(reason_phrase,
      stun_attr_errcode_reason(attr_errcode),
      sizeof(reason_phrase)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_UNKNOWN_ATTRIBUTES, stun_attr_type(attr_hdr));
  stun_attr_unknown *attr_unk = (stun_attr_unknown *)attr_hdr;
  ASSERT_EQ(ARRAY_SIZE(unknown), stun_attr_unknown_count(attr_unk));
  for (size_t i = 0; i < ARRAY_SIZE(unknown); i++) {
    EXPECT_EQ(unknown[i], stun_attr_unknown_get(attr_unk, i));
  }

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}